

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reactive_socket_accept_op.hpp
# Opt level: O2

status asio::detail::
       reactive_socket_accept_op_base<asio::basic_socket<asio::ip::tcp,_asio::any_io_executor>,_asio::ip::tcp>
       ::do_perform(reactor_op *base)

{
  error_category *addr;
  socket_type sVar1;
  bool bVar2;
  void **addrlen;
  socket_type new_socket;
  socket_type local_1c;
  
  local_1c = -1;
  addr = base[1].ec_._M_cat;
  addrlen = &base[1].cancellation_key_;
  if (addr == (error_category *)0x0) {
    addrlen = (void **)0x0;
  }
  bVar2 = socket_ops::non_blocking_accept
                    (*(socket_type *)&base[1].super_operation.next_,
                     *(state_type *)((long)&base[1].super_operation.next_ + 4),addr,
                     (size_t *)addrlen,&base->ec_,&local_1c);
  sVar1 = local_1c;
  socket_holder::reset((socket_holder *)&base[1].super_operation.func_);
  *(socket_type *)&base[1].super_operation.func_ = sVar1;
  return (uint)bVar2;
}

Assistant:

static status do_perform(reactor_op* base)
  {
    ASIO_ASSUME(base != 0);
    reactive_socket_accept_op_base* o(
        static_cast<reactive_socket_accept_op_base*>(base));

    socket_type new_socket = invalid_socket;
    status result = socket_ops::non_blocking_accept(o->socket_,
        o->state_, o->peer_endpoint_ ? o->peer_endpoint_->data() : 0,
        o->peer_endpoint_ ? &o->addrlen_ : 0, o->ec_, new_socket)
    ? done : not_done;
    o->new_socket_.reset(new_socket);

    ASIO_HANDLER_REACTOR_OPERATION((*o, "non_blocking_accept", o->ec_));

    return result;
  }